

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

container_t * convert_run_optimize(container_t *c,uint8_t typecode_original,uint8_t *typecode_after)

{
  uint uVar1;
  rle16_t *prVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  ushort uVar6;
  int32_t size;
  uint uVar7;
  int iVar8;
  run_container_t *prVar9;
  ulong uVar10;
  undefined7 in_register_00000031;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  
  iVar8 = (int)CONCAT71(in_register_00000031,typecode_original);
  prVar9 = (run_container_t *)c;
  if (iVar8 == 2) {
    size = array_container_number_of_runs((array_container_t *)c);
    uVar1 = *c;
    if (size * 4 < (int)(uVar1 * 2)) {
      prVar9 = run_container_create_given_capacity(size);
      if ((int)uVar1 < 1) {
        uVar6 = 0xfffe;
        uVar13 = 0xffffffff;
      }
      else {
        lVar4 = *(long *)((long)c + 8);
        uVar13 = 0xffffffff;
        uVar7 = 0xfffffffe;
        uVar11 = 0;
        do {
          uVar6 = *(ushort *)(lVar4 + uVar11 * 2);
          uVar5 = uVar13;
          if ((uVar7 + 1 != (uint)uVar6) && (uVar5 = (uint)uVar6, uVar13 != 0xffffffff)) {
            prVar2 = prVar9->runs;
            iVar8 = prVar9->n_runs;
            prVar2[iVar8].value = (uint16_t)uVar13;
            prVar2[iVar8].length = (short)uVar7 - (uint16_t)uVar13;
            prVar9->n_runs = iVar8 + 1;
          }
          uVar13 = uVar5;
          uVar6 = *(ushort *)(lVar4 + uVar11 * 2);
          uVar7 = (uint)uVar6;
          uVar11 = uVar11 + 1;
        } while (uVar1 != uVar11);
      }
      prVar2 = prVar9->runs;
      iVar8 = prVar9->n_runs;
      prVar2[iVar8].value = (uint16_t)uVar13;
      prVar2[iVar8].length = uVar6 - (uint16_t)uVar13;
      prVar9->n_runs = iVar8 + 1;
      *typecode_after = '\x03';
      array_container_free((array_container_t *)c);
    }
    else {
      *typecode_after = '\x02';
    }
  }
  else if (iVar8 == 3) {
    prVar9 = (run_container_t *)
             convert_run_to_efficient_container((run_container_t *)c,typecode_after);
    if (prVar9 != (run_container_t *)c) {
      container_free(c,typecode_original);
    }
  }
  else {
    iVar8 = bitset_container_number_of_runs((bitset_container_t *)c);
    if (iVar8 * 4 + 2 < 0x2000) {
      prVar9 = run_container_create_given_capacity(iVar8);
      uVar14 = **(ulong **)((long)c + 8);
      uVar11 = 0;
      do {
        bVar15 = uVar14 == 0;
        if ((bVar15) && ((int)uVar11 < 0x3ff)) {
          uVar10 = (long)(int)uVar11;
          do {
            uVar11 = uVar10 + 1;
            uVar14 = *(ulong *)(*(long *)((long)c + 8) + 8 + uVar10 * 8);
            bVar15 = uVar14 == 0;
            if (!bVar15) break;
            bVar3 = (long)uVar10 < 0x3fe;
            uVar10 = uVar11;
          } while (bVar3);
        }
        else {
          uVar11 = uVar11 & 0xffffffff;
        }
        if (bVar15) {
          bitset_container_free((bitset_container_t *)c);
          *typecode_after = '\x03';
          return prVar9;
        }
        uVar10 = uVar14 - 1 | uVar14;
        bVar15 = uVar10 == 0xffffffffffffffff;
        iVar8 = (int)uVar11;
        uVar11 = uVar11 & 0xffffffff;
        if ((bVar15) && (iVar8 < 0x3ff)) {
          uVar12 = (long)iVar8;
          do {
            uVar11 = uVar12 + 1;
            uVar10 = *(ulong *)(*(long *)((long)c + 8) + 8 + uVar12 * 8);
            bVar15 = uVar10 == 0xffffffffffffffff;
            if (!bVar15) break;
            bVar3 = (long)uVar12 < 0x3fe;
            uVar12 = uVar11;
          } while (bVar3);
        }
        lVar4 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        uVar6 = (ushort)(iVar8 << 6) | (ushort)lVar4;
        if (bVar15) {
          prVar2 = prVar9->runs;
          iVar8 = prVar9->n_runs;
          prVar2[iVar8].value = uVar6;
          prVar2[iVar8].length = ((short)uVar11 * 0x40 - uVar6) + 0x3f;
          prVar9->n_runs = iVar8 + 1;
          bitset_container_free((bitset_container_t *)c);
          *typecode_after = '\x03';
        }
        else {
          lVar4 = 0;
          if (~uVar10 != 0) {
            for (; (~uVar10 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          prVar2 = prVar9->runs;
          iVar8 = prVar9->n_runs;
          prVar2[iVar8].value = uVar6;
          prVar2[iVar8].length = ~uVar6 + (short)((int)uVar11 << 6) + (short)lVar4;
          prVar9->n_runs = iVar8 + 1;
          uVar14 = uVar10 + 1 & uVar10;
        }
      } while (!bVar15);
    }
    else {
      *typecode_after = '\x01';
    }
  }
  return prVar9;
}

Assistant:

container_t *convert_run_optimize(container_t *c, uint8_t typecode_original,
                                  uint8_t *typecode_after) {
    if (typecode_original == RUN_CONTAINER_TYPE) {
        container_t *newc =
            convert_run_to_efficient_container(CAST_run(c), typecode_after);
        if (newc != c) {
            container_free(c, typecode_original);
        }
        return newc;
    } else if (typecode_original == ARRAY_CONTAINER_TYPE) {
        // it might need to be converted to a run container.
        array_container_t *c_qua_array = CAST_array(c);
        int32_t n_runs = array_container_number_of_runs(c_qua_array);
        int32_t size_as_run_container =
            run_container_serialized_size_in_bytes(n_runs);
        int32_t card = array_container_cardinality(c_qua_array);
        int32_t size_as_array_container =
            array_container_serialized_size_in_bytes(card);

        if (size_as_run_container >= size_as_array_container) {
            *typecode_after = ARRAY_CONTAINER_TYPE;
            return c;
        }
        // else convert array to run container
        run_container_t *answer = run_container_create_given_capacity(n_runs);
        int prev = -2;
        int run_start = -1;

        assert(card > 0);
        for (int i = 0; i < card; ++i) {
            uint16_t cur_val = c_qua_array->array[i];
            if (cur_val != prev + 1) {
                // new run starts; flush old one, if any
                if (run_start != -1) add_run(answer, run_start, prev);
                run_start = cur_val;
            }
            prev = c_qua_array->array[i];
        }
        assert(run_start >= 0);
        // now prev is the last seen value
        add_run(answer, run_start, prev);
        *typecode_after = RUN_CONTAINER_TYPE;
        array_container_free(c_qua_array);
        return answer;
    } else if (typecode_original ==
               BITSET_CONTAINER_TYPE) {  // run conversions on bitset
        // does bitset need conversion to run?
        bitset_container_t *c_qua_bitset = CAST_bitset(c);
        int32_t n_runs = bitset_container_number_of_runs(c_qua_bitset);
        int32_t size_as_run_container =
            run_container_serialized_size_in_bytes(n_runs);
        int32_t size_as_bitset_container =
            bitset_container_serialized_size_in_bytes();

        if (size_as_bitset_container <= size_as_run_container) {
            // no conversion needed.
            *typecode_after = BITSET_CONTAINER_TYPE;
            return c;
        }
        // bitset to runcontainer (ported from Java  RunContainer(
        // BitmapContainer bc, int nbrRuns))
        assert(n_runs > 0);  // no empty bitmaps
        run_container_t *answer = run_container_create_given_capacity(n_runs);

        int long_ctr = 0;
        uint64_t cur_word = c_qua_bitset->words[0];
        while (true) {
            while (cur_word == UINT64_C(0) &&
                   long_ctr < BITSET_CONTAINER_SIZE_IN_WORDS - 1)
                cur_word = c_qua_bitset->words[++long_ctr];

            if (cur_word == UINT64_C(0)) {
                bitset_container_free(c_qua_bitset);
                *typecode_after = RUN_CONTAINER_TYPE;
                return answer;
            }

            int local_run_start = roaring_trailing_zeroes(cur_word);
            int run_start = local_run_start + 64 * long_ctr;
            uint64_t cur_word_with_1s = cur_word | (cur_word - 1);

            int run_end = 0;
            while (cur_word_with_1s == UINT64_C(0xFFFFFFFFFFFFFFFF) &&
                   long_ctr < BITSET_CONTAINER_SIZE_IN_WORDS - 1)
                cur_word_with_1s = c_qua_bitset->words[++long_ctr];

            if (cur_word_with_1s == UINT64_C(0xFFFFFFFFFFFFFFFF)) {
                run_end = 64 + long_ctr * 64;  // exclusive, I guess
                add_run(answer, run_start, run_end - 1);
                bitset_container_free(c_qua_bitset);
                *typecode_after = RUN_CONTAINER_TYPE;
                return answer;
            }
            int local_run_end = roaring_trailing_zeroes(~cur_word_with_1s);
            run_end = local_run_end + long_ctr * 64;
            add_run(answer, run_start, run_end - 1);
            cur_word = cur_word_with_1s & (cur_word_with_1s + 1);
        }
        return answer;
    } else {
        assert(false);
        roaring_unreachable;
        return NULL;
    }
}